

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O0

void __thiscall
BinaryEqualFailure::BinaryEqualFailure
          (BinaryEqualFailure *this,UtestShell *test,char *fileName,size_t lineNumber,
          uchar *expected,uchar *actual,size_t size,SimpleString *text)

{
  SimpleString *in_RDI;
  long in_R8;
  long in_R9;
  size_t failStart;
  size_t in_stack_00000030;
  size_t in_stack_00000038;
  SimpleString *in_stack_00000040;
  SimpleString actualHex;
  SimpleString *in_stack_ffffffffffffff58;
  SimpleString *in_stack_ffffffffffffff68;
  SimpleString *in_stack_ffffffffffffff70;
  TestFailure *in_stack_ffffffffffffff78;
  long lVar1;
  size_t in_stack_ffffffffffffff98;
  SimpleString *in_stack_ffffffffffffffa0;
  TestFailure *in_stack_ffffffffffffffa8;
  TestFailure *in_stack_ffffffffffffffb0;
  
  TestFailure::TestFailure
            (in_stack_ffffffffffffffb0,(UtestShell *)in_stack_ffffffffffffffa8,
             (char *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  in_RDI->buffer_ = (char *)&PTR__BinaryEqualFailure_00136c50;
  TestFailure::createUserText(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  SimpleString::operator=(in_RDI,in_stack_ffffffffffffff58);
  SimpleString::~SimpleString((SimpleString *)0x118ca0);
  StringFromBinaryOrNull((uchar *)in_stack_ffffffffffffff68,(size_t)in_RDI);
  StringFromBinaryOrNull((uchar *)in_stack_ffffffffffffff68,(size_t)in_RDI);
  TestFailure::createButWasString
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  SimpleString::operator+=(in_RDI,in_stack_ffffffffffffff58);
  SimpleString::~SimpleString((SimpleString *)0x118d0f);
  SimpleString::~SimpleString((SimpleString *)0x118d19);
  if ((in_R8 != 0) && (in_R9 != 0)) {
    for (lVar1 = 0; *(char *)(in_R9 + lVar1) == *(char *)(in_R8 + lVar1); lVar1 = lVar1 + 1) {
    }
    TestFailure::createDifferenceAtPosString
              ((TestFailure *)actualHex.buffer_,in_stack_00000040,in_stack_00000038,
               in_stack_00000030);
    SimpleString::operator+=(in_RDI,in_stack_ffffffffffffff58);
    SimpleString::~SimpleString((SimpleString *)0x118e2c);
  }
  SimpleString::~SimpleString((SimpleString *)0x118e52);
  return;
}

Assistant:

BinaryEqualFailure::BinaryEqualFailure(UtestShell* test, const char* fileName, size_t lineNumber, const unsigned char* expected,
                                       const unsigned char* actual, size_t size, const SimpleString& text)
: TestFailure(test, fileName, lineNumber)
{
    message_ = createUserText(text);

    SimpleString actualHex = StringFromBinaryOrNull(actual, size);

	message_ += createButWasString(StringFromBinaryOrNull(expected, size), actualHex);
	if ((expected) && (actual))
	{
		size_t failStart;
		for (failStart = 0; actual[failStart] == expected[failStart]; failStart++)
			;
		message_ += createDifferenceAtPosString(actualHex, (failStart * 3 + 1), failStart);
	}
}